

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void helper_sske(CPUS390XState_conflict *env,uint64_t r1,uint64_t r2)

{
  ulong uVar1;
  CPUState *pCVar2;
  CPUS390XState_conflict *__mptr;
  uint8_t key;
  
  uVar1 = (env->psw).mask;
  pCVar2 = env->uc->cpu;
  if ((uVar1 >> 0x20 & 1) == 0) {
    if ((int)uVar1 < 0) {
      r2 = (uint64_t)((uint)r2 & 0x7fffffff);
    }
    else {
      r2 = (uint64_t)((uint)r2 & 0xffffff);
    }
  }
  (**(code **)&pCVar2[1].tb_jmp_cache[0x1fc]->flags)(pCVar2[1].tb_jmp_cache + 0x1f9,r2 >> 0xc,1);
  tlb_flush_all_cpus_synced_s390x((CPUState *)(env[-0x1e].vregs + 0xf));
  return;
}

Assistant:

void HELPER(sske)(CPUS390XState *env, uint64_t r1, uint64_t r2)
{
    S390SKeysState *ss = (S390SKeysState *)(&((S390CPU *)env->uc->cpu)->ss);
    S390SKeysClass *skeyclass = S390_SKEYS_GET_CLASS(ss);
    uint64_t addr = wrap_address(env, r2);
    uint8_t key;

#if 0
    if (addr > ram_size) {
        return;
    }
#endif

    key = (uint8_t) r1;
    skeyclass->set_skeys(ss, addr / TARGET_PAGE_SIZE, 1, &key);
   /*
    * As we can only flush by virtual address and not all the entries
    * that point to a physical address we have to flush the whole TLB.
    */
    tlb_flush_all_cpus_synced(env_cpu(env));
}